

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void add256(uint16_t *out,uint16_t *a,uint16_t *b)

{
  uint uVar1;
  uint32_t carry;
  int i;
  uint16_t *b_local;
  uint16_t *a_local;
  uint16_t *out_local;
  
  carry = 0;
  for (i = 0; i < 0x10; i = i + 1) {
    uVar1 = (uint)b[i] + a[i] + carry;
    out[i] = (uint16_t)uVar1;
    carry = uVar1 >> 0x10;
  }
  return;
}

Assistant:

static void add256(uint16_t* out, const uint16_t* a, const uint16_t* b) {
    int i;
    uint32_t carry = 0;
    for (i = 0; i < 16; ++i) {
        carry += a[i];
        carry += b[i];
        out[i] = carry;
        carry >>= 16;
    }
}